

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlCubemapParameters(uint id,int param,int value)

{
  GLenum GVar1;
  char *text;
  GLfloat GVar2;
  
  (*glad_glBindTexture)(0x8513,id);
  (*glad_glTexParameterf)(0x8513,0x84fe,1.0);
  if (param < 0x3000) {
    if (1 < param - 0x2800U) {
      if (1 < param - 0x2802U) goto LAB_001189e4;
      if (value == 0x8742) {
        if (RLGL.ExtSupported.texMirrorClamp != true) {
          text = "GL: Clamp mirror wrap mode not supported (GL_MIRROR_CLAMP_EXT)";
          goto LAB_001189d8;
        }
        value = 0x8742;
      }
    }
    (*glad_glTexParameteri)(0x8513,param,value);
  }
  else {
    if (param == 0x3000) {
      GVar2 = (GLfloat)value;
      if (GVar2 <= RLGL.ExtSupported.maxAnisotropyLevel) {
        GVar1 = 0x84fe;
      }
      else {
        if (RLGL.ExtSupported.maxAnisotropyLevel <= 0.0) {
          text = "GL: Anisotropic filtering not supported";
LAB_001189d8:
          TraceLog(4,text);
          goto LAB_001189e4;
        }
        TraceLog(4,"GL: Maximum anisotropic filter level supported is %iX",(ulong)id,
                 (ulong)(uint)(int)RLGL.ExtSupported.maxAnisotropyLevel);
        GVar1 = 0x84fe;
      }
    }
    else {
      if (param != 0x4000) goto LAB_001189e4;
      GVar2 = (float)value / 100.0;
      GVar1 = 0x8501;
    }
    (*glad_glTexParameterf)(0x8513,GVar1,GVar2);
  }
LAB_001189e4:
  (*glad_glBindTexture)(0x8513,0);
  return;
}

Assistant:

void rlCubemapParameters(unsigned int id, int param, int value)
{
#if !defined(GRAPHICS_API_OPENGL_11)
    glBindTexture(GL_TEXTURE_CUBE_MAP, id);

    // Reset anisotropy filter, in case it was set
    glTexParameterf(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAX_ANISOTROPY_EXT, 1.0f);

    switch (param)
    {
        case RL_TEXTURE_WRAP_S:
        case RL_TEXTURE_WRAP_T:
        {
            if (value == RL_TEXTURE_WRAP_MIRROR_CLAMP)
            {
                if (RLGL.ExtSupported.texMirrorClamp) glTexParameteri(GL_TEXTURE_CUBE_MAP, param, value);
                else TRACELOG(RL_LOG_WARNING, "GL: Clamp mirror wrap mode not supported (GL_MIRROR_CLAMP_EXT)");
            }
            else glTexParameteri(GL_TEXTURE_CUBE_MAP, param, value);

        } break;
        case RL_TEXTURE_MAG_FILTER:
        case RL_TEXTURE_MIN_FILTER: glTexParameteri(GL_TEXTURE_CUBE_MAP, param, value); break;
        case RL_TEXTURE_FILTER_ANISOTROPIC:
        {
            if (value <= RLGL.ExtSupported.maxAnisotropyLevel) glTexParameterf(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAX_ANISOTROPY_EXT, (float)value);
            else if (RLGL.ExtSupported.maxAnisotropyLevel > 0.0f)
            {
                TRACELOG(RL_LOG_WARNING, "GL: Maximum anisotropic filter level supported is %iX", id, (int)RLGL.ExtSupported.maxAnisotropyLevel);
                glTexParameterf(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAX_ANISOTROPY_EXT, (float)value);
            }
            else TRACELOG(RL_LOG_WARNING, "GL: Anisotropic filtering not supported");
        } break;
#if defined(GRAPHICS_API_OPENGL_33)
        case RL_TEXTURE_MIPMAP_BIAS_RATIO: glTexParameterf(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_LOD_BIAS, value/100.0f);
#endif
        default: break;
    }

    glBindTexture(GL_TEXTURE_CUBE_MAP, 0);
#endif
}